

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_layout_space_to_local(nk_context *ctx,nk_vec2 ret)

{
  nk_panel *pnVar1;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  nk_vec2 ret_local;
  
  pnVar1 = ctx->current->layout;
  ret_local.x = ret.x;
  ret_local.y = ret.y;
  ret_local.y = ret_local.y + ((float)pnVar1->offset->y - pnVar1->at_y);
  ret_local.x = ret_local.x + ((float)pnVar1->offset->x - pnVar1->at_x);
  return ret_local;
}

Assistant:

NK_API struct nk_vec2
nk_layout_space_to_local(struct nk_context *ctx, struct nk_vec2 ret)
{
    struct nk_window *win;
    struct nk_panel *layout;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    win = ctx->current;
    layout = win->layout;

    ret.x += -layout->at_x + layout->offset->x;
    ret.y += -layout->at_y + layout->offset->y;
    return ret;
}